

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool __thiscall ON_3dmSettings::Write(ON_3dmSettings *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = ON_BinaryArchive::Archive3dmVersion(file);
  if (iVar2 == 1) {
    bVar1 = Write_v1(this,file);
    return bVar1;
  }
  bVar1 = Write_v2(this,file);
  return bVar1;
}

Assistant:

bool ON_3dmSettings::Write(ON_BinaryArchive& file) const
{
  bool rc = false;
  if ( 1 == file.Archive3dmVersion() ) 
  {
    rc = Write_v1(file); 
  }
  else
  {
    rc = Write_v2(file); 
  }
  return rc;
}